

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O2

void __thiscall bloaty::RollupOutput::~RollupOutput(RollupOutput *this)

{
  std::__cxx11::string::~string((string *)&this->disassembly_);
  RollupRow::~RollupRow(&this->toplevel_row_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->source_names_);
  return;
}

Assistant:

RollupOutput() : toplevel_row_("TOTAL") {}